

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O1

uint64 crnlib::dxt_fast::determine_error
                 (uint n,color_quad_u8 *block,uint min16,uint max16,uint64 early_out_error)

{
  int i;
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  byte local_58 [16];
  int local_48 [6];
  color_quad_u8 color [4];
  int stops [4];
  
  local_58[0] = (&ryg_dxt::Expand5)[min16 >> 0xb & 0x1f];
  local_58[1] = (&ryg_dxt::Expand6)[min16 >> 5 & 0x3f];
  local_58[2] = (&ryg_dxt::Expand5)[min16 & 0x1f];
  lVar2 = 0;
  local_58[3] = 0;
  local_58[4] = (&ryg_dxt::Expand5)[max16 >> 0xb & 0x1f];
  local_58[5] = (&ryg_dxt::Expand6)[max16 >> 5 & 0x3f];
  local_58[6] = (&ryg_dxt::Expand5)[max16 & 0x1f];
  local_58[7] = 0;
  local_58[8] = (char)(((uint)local_58[4] + (uint)local_58[0] * 2) / 3);
  local_58[9] = (char)(((uint)local_58[5] + (uint)local_58[1] * 2) / 3);
  local_58[10] = (char)(((uint)local_58[6] + (uint)local_58[2] * 2) / 3);
  local_58[0xc] = (char)(((uint)local_58[0] + (uint)local_58[4] * 2) / 3);
  local_58[0xd] = (char)(((uint)local_58[1] + (uint)local_58[5] * 2) / 3);
  local_58[0xe] = (char)(((uint)local_58[2] + (uint)local_58[6] * 2) / 3);
  do {
    local_48[lVar2] =
         (uint)*(byte *)((long)local_48 + lVar2 * 4 + -0xe) *
         ((uint)local_58[2] - (uint)local_58[6]) +
         (uint)*(byte *)((long)local_48 + lVar2 * 4 + -0xf) *
         ((uint)local_58[1] - (uint)local_58[5]) +
         (uint)*(byte *)(local_48 + lVar2 + -4) * ((uint)local_58[0] - (uint)local_58[4]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (n == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    lVar2 = 0;
    do {
      if (min16 == max16) {
        uVar4 = 0;
      }
      else {
        iVar1 = (uint)block[lVar2].field_0.field_0.b * ((uint)local_58[2] - (uint)local_58[6]) +
                (uint)block[lVar2].field_0.field_0.g * ((uint)local_58[1] - (uint)local_58[5]) +
                (uint)block[lVar2].field_0.field_0.r * ((uint)local_58[0] - (uint)local_58[4]);
        uVar4 = (ulong)((uint)(iVar1 < local_48[2] + local_48[0] >> 1) * 2);
        if (iVar1 < local_48[3] + local_48[2] >> 1) {
          uVar4 = (ulong)(local_48[1] + local_48[3] >> 1 <= iVar1) * 2 + 1;
        }
      }
      iVar5 = (uint)block[lVar2].field_0.field_0.r - (uint)*(byte *)(local_48 + (uVar4 - 4));
      iVar6 = (uint)block[lVar2].field_0.field_0.g -
              (uint)*(byte *)((long)local_48 + uVar4 * 4 + -0xf);
      iVar1 = (uint)block[lVar2].field_0.field_0.b -
              (uint)*(byte *)((long)local_48 + uVar4 * 4 + -0xe);
      uVar3 = (ulong)(uint)(iVar1 * iVar1) + (ulong)(uint)(iVar6 * iVar6) +
              uVar3 + (uint)(iVar5 * iVar5);
    } while ((uVar3 < early_out_error) && (iVar1 = (int)lVar2, lVar2 = lVar2 + 1, n - 1 != iVar1));
  }
  return uVar3;
}

Assistant:

static uint64 determine_error(uint n, const color_quad_u8* block, uint min16, uint max16, uint64 early_out_error)
        {
            color_quad_u8 color[4];

            eval_colors(color, min16, max16);

            int dirr = color[0].r - color[1].r;
            int dirg = color[0].g - color[1].g;
            int dirb = color[0].b - color[1].b;

            int stops[4];
            for (int i = 0; i < 4; i++)
            {
                stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;
            }

            // 0 2 3 1
            int c0Point = stops[1] + stops[3];
            int halfPoint = stops[3] + stops[2];
            int c3Point = stops[2] + stops[0];

            c0Point >>= 1;
            halfPoint >>= 1;
            c3Point >>= 1;

            uint64 total_error = 0;

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& a = block[i];

                uint s = 0;
                if (min16 != max16)
                {
                    int dot = a.r * dirr + a.g * dirg + a.b * dirb;

                    if (dot < halfPoint)
                    {
                        s = (dot < c0Point) ? 1 : 3;
                    }
                    else
                    {
                        s = (dot < c3Point) ? 2 : 0;
                    }
                }

                const color_quad_u8& b = color[s];

                int e = a[0] - b[0];
                total_error += e * e;

                e = a[1] - b[1];
                total_error += e * e;

                e = a[2] - b[2];
                total_error += e * e;

                if (total_error >= early_out_error)
                {
                    break;
                }
            }

            return total_error;
        }